

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

bool __thiscall
re2::PCRE::Rewrite(PCRE *this,string *out,StringPiece *rewrite,StringPiece *text,int *vec,int veclen
                  )

{
  StringPiece *pSVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  LogMessage local_368;
  int local_1e8;
  int start;
  LogMessage local_1d8;
  int local_58;
  int local_54;
  int n;
  int c;
  char *end;
  char *s;
  int number_of_capturing_groups;
  int veclen_local;
  int *vec_local;
  StringPiece *text_local;
  StringPiece *rewrite_local;
  string *out_local;
  PCRE *this_local;
  
  s._4_4_ = veclen;
  _number_of_capturing_groups = vec;
  vec_local = (int *)text;
  text_local = rewrite;
  rewrite_local = (StringPiece *)out;
  out_local = &this->pattern_;
  s._0_4_ = NumberOfCapturingGroups(this);
  pcVar3 = StringPiece::data(text_local);
  end = pcVar3;
  iVar2 = StringPiece::size(text_local);
  _n = pcVar3 + iVar2;
  do {
    if (_n <= end) {
      return true;
    }
    local_54 = (int)*end;
    if (local_54 == 0x5c) {
      local_54 = (int)end[1];
      end = end + 1;
      iVar2 = isdigit(local_54);
      pSVar1 = rewrite_local;
      if (iVar2 == 0) {
        if (local_54 != 0x5c) {
          LogMessage::LogMessage
                    (&local_368,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc"
                     ,0x29e,2);
          poVar4 = LogMessage::stream(&local_368);
          poVar4 = std::operator<<(poVar4,"invalid rewrite pattern: ");
          pcVar3 = StringPiece::data(text_local);
          std::operator<<(poVar4,pcVar3);
          LogMessage::~LogMessage(&local_368);
          return false;
        }
        std::__cxx11::string::push_back((char)rewrite_local);
      }
      else {
        local_58 = local_54 + -0x30;
        if ((s._4_4_ <= local_58) && ((int)s < local_58)) {
          LogMessage::LogMessage
                    (&local_1d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc"
                     ,0x293,2);
          poVar4 = LogMessage::stream(&local_1d8);
          poVar4 = std::operator<<(poVar4,"requested group ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_58);
          poVar4 = std::operator<<(poVar4," in regexp ");
          pcVar3 = StringPiece::data(text_local);
          std::operator<<(poVar4,pcVar3);
          LogMessage::~LogMessage(&local_1d8);
          return false;
        }
        local_1e8 = _number_of_capturing_groups[local_58 * 2];
        if (-1 < local_1e8) {
          pcVar3 = StringPiece::data((StringPiece *)vec_local);
          std::__cxx11::string::append((char *)pSVar1,(ulong)(pcVar3 + local_1e8));
        }
      }
    }
    else {
      std::__cxx11::string::push_back((char)rewrite_local);
    }
    end = end + 1;
  } while( true );
}

Assistant:

bool PCRE::Rewrite(string *out, const StringPiece &rewrite,
                 const StringPiece &text, int *vec, int veclen) const {
  int number_of_capturing_groups = NumberOfCapturingGroups();
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    int c = *s;
    if (c == '\\') {
      c = *++s;
      if (isdigit(c)) {
        int n = (c - '0');
        if (n >= veclen) {
          if (n <= number_of_capturing_groups) {
            // unmatched optional capturing group. treat
            // its value as empty string; i.e., nothing to append.
          } else {
            PCREPORT(ERROR) << "requested group " << n
                          << " in regexp " << rewrite.data();
            return false;
          }
        }
        int start = vec[2 * n];
        if (start >= 0)
          out->append(text.data() + start, vec[2 * n + 1] - start);
      } else if (c == '\\') {
        out->push_back('\\');
      } else {
        PCREPORT(ERROR) << "invalid rewrite pattern: " << rewrite.data();
        return false;
      }
    } else {
      out->push_back(c);
    }
  }
  return true;
}